

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O1

QTlsBackend * QTlsBackend::findBackend(QString *backendName)

{
  QDebug this;
  Type *this_00;
  QTlsBackend *pQVar1;
  QLoggingCategory *pQVar2;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QDebug local_40;
  QArrayData *local_38 [3];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (-2 < (char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_backends>::guard._q_value.
                 super___atomic_base<signed_char>._M_i) {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_backends>_>::instance();
    this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_backends>_>::
              instance();
    pQVar1 = anon_unknown.dwarf_589d8e::BackendCollection::backend(this_00,backendName);
    if (pQVar1 != (QTlsBackend *)0x0) goto LAB_001d372b;
    pQVar2 = QtPrivateLogging::lcSsl();
    if (((pQVar2->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      QMessageLogger::warning();
      this.stream = local_40.stream;
      QVar4.m_data = (storage_type *)0x23;
      QVar4.m_size = (qsizetype)local_38;
      QString::fromUtf8(QVar4);
      QTextStream::operator<<((QTextStream *)this.stream,(QString *)local_38);
      if (local_38[0] != (QArrayData *)0x0) {
        LOCK();
        (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_38[0],2,0x10);
        }
      }
      if (*(QTextStream *)(local_40.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_40.stream,' ');
      }
      pcVar3 = (backendName->d).ptr;
      if (pcVar3 == (char16_t *)0x0) {
        pcVar3 = (char16_t *)&QString::_empty;
      }
      QDebug::putString((QChar *)&local_40,(ulong)pcVar3);
      if (*(QTextStream *)(local_40.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_40.stream,' ');
      }
      QDebug::~QDebug(&local_40);
    }
  }
  pQVar1 = (QTlsBackend *)0x0;
LAB_001d372b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QTlsBackend *QTlsBackend::findBackend(const QString &backendName)
{
    if (!backends())
        return {};

    if (auto *fct = backends->backend(backendName))
        return fct;

    qCWarning(lcSsl) << "Cannot create unknown backend named" << backendName;
    return nullptr;
}